

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

void queued_activate(QObject *sender,int signal,Connection *c,void **argv)

{
  QBasicMutex *this;
  __pointer_type pQVar1;
  __pointer_type pQVar2;
  QObject *receiver;
  int __sig;
  int *piVar3;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  void **ppvVar7;
  ulong uVar8;
  ulong uVar9;
  void **ppvVar10;
  long in_FS_OFFSET;
  bool bVar11;
  SlotObjectGuard slotObjectGuard;
  QMetaCallEvent *local_70;
  QMetaType local_50;
  QMetaMethod local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  piVar3 = (c->argumentTypes).super_QBasicAtomicPointer<const_int>._q_value._M_b._M_p;
  if (piVar3 == (int *)0x0) {
    local_48.mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
    __sig = (**sender->_vptr_QObject)(sender);
    local_48.mobj =
         (QMetaObject *)QMetaObjectPrivate::signal(__sig,(__sighandler_t)(ulong)(uint)signal);
    piVar3 = queuedConnectionTypes(&local_48);
    if (piVar3 == (int *)0x0) {
      piVar3 = &DIRECT_CONNECTION_ONLY;
    }
    LOCK();
    bVar11 = (c->argumentTypes).super_QBasicAtomicPointer<const_int>._q_value._M_b._M_p ==
             (__pointer_type)0x0;
    if (bVar11) {
      (c->argumentTypes).super_QBasicAtomicPointer<const_int>._q_value._M_b._M_p = piVar3;
    }
    UNLOCK();
    if (!bVar11) {
      if (piVar3 != &DIRECT_CONNECTION_ONLY) {
        operator_delete__(piVar3);
      }
      piVar3 = (c->argumentTypes).super_QBasicAtomicPointer<const_int>._q_value._M_b._M_p;
    }
  }
  if (piVar3 == &DIRECT_CONNECTION_ONLY) goto LAB_002bda54;
  uVar9 = 0;
  do {
    uVar8 = uVar9;
    uVar9 = uVar8 + 1;
  } while (piVar3[uVar8] != 0);
  pQVar2 = (c->receiver).super_QBasicAtomicPointer<QObject>._q_value._M_b._M_p;
  uVar5 = (ulong)((int)pQVar2 + (int)(((ulong)pQVar2 & 0xffffffff) / 0x418) * -0x418 & 0x7f8);
  this = (QBasicMutex *)((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + uVar5);
  if (*(long *)((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + uVar5) == 0) {
    LOCK();
    bVar11 = (this->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar11) {
      (this->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar11) goto LAB_002bd860;
  }
  else {
LAB_002bd860:
    QBasicMutex::lockInternal(this);
  }
  receiver = (c->receiver).super_QBasicAtomicPointer<QObject>._q_value._M_b._M_p;
  if (receiver != (QObject *)0x0) {
    if ((c->field_0x57 & 0x20) == 0) {
      local_48.mobj = (QMetaObject *)0x0;
    }
    else {
      local_48.mobj = (QMetaObject *)(c->field_6).slotObj;
    }
    if ((QSlotObjectBase *)local_48.mobj != (QSlotObjectBase *)0x0) {
      LOCK();
      (((QSlotObjectBase *)local_48.mobj)->m_ref).super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((QSlotObjectBase *)local_48.mobj)->m_ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    LOCK();
    pQVar1 = (this->d_ptr)._q_value._M_b._M_p;
    (this->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if (pQVar1 != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex(this,pQVar1);
    }
    if ((c->field_0x57 & 0x20) == 0) {
      local_70 = (QMetaCallEvent *)operator_new(0x78);
      QMetaCallEvent::QMetaCallEvent
                (local_70,c->method_offset,c->method_relative,(c->field_6).callFunction,sender,
                 signal,(int)uVar9);
    }
    else {
      local_70 = (QMetaCallEvent *)operator_new(0x78);
      QMetaCallEvent::QMetaCallEvent(local_70,(c->field_6).slotObj,sender,signal,(int)uVar9);
    }
    ppvVar7 = (local_70->d).args_;
    lVar6 = (long)(local_70->d).nargs_;
    ppvVar7[lVar6] = (void *)0x0;
    *ppvVar7 = (void *)0x0;
    if (1 < uVar9) {
      uVar9 = 0;
      do {
        QMetaType::QMetaType(&local_50,piVar3[uVar9]);
        ppvVar7[lVar6 + uVar9 + 1] = local_50.d_ptr;
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
      ppvVar10 = argv + 1;
      do {
        ppvVar7 = ppvVar7 + 1;
        pvVar4 = QMetaType::create((QMetaType *)(ppvVar7 + lVar6),*ppvVar10);
        *ppvVar7 = pvVar4;
        ppvVar10 = ppvVar10 + 1;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    if ((-1 < *(int *)&c->field_0x54) || (bVar11 = QObjectPrivate::removeConnection(c), bVar11)) {
      if ((this->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0) {
        LOCK();
        bVar11 = (this->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
        if (bVar11) {
          (this->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
        }
        UNLOCK();
        if (!bVar11) goto LAB_002bd9db;
      }
      else {
LAB_002bd9db:
        QBasicMutex::lockInternal(this);
      }
      if ((-1 < *(int *)&c->field_0x54) &&
         ((c->receiver).super_QBasicAtomicPointer<QObject>._q_value._M_b._M_p == (__pointer_type)0x0
         )) {
        LOCK();
        pQVar1 = (this->d_ptr)._q_value._M_b._M_p;
        (this->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
        UNLOCK();
        if (pQVar1 != (__pointer_type)0x1) {
          QBasicMutex::unlockInternalFutex(this,pQVar1);
        }
        goto LAB_002bda1b;
      }
      bVar11 = true;
      QCoreApplication::postEvent(receiver,(QEvent *)local_70,0);
    }
    else {
LAB_002bda1b:
      (*(local_70->super_QAbstractMetaCallEvent).super_QEvent._vptr_QEvent[1])();
      bVar11 = false;
    }
    if ((QSlotObjectBase *)local_48.mobj != (QSlotObjectBase *)0x0) {
      QtPrivate::QSlotObjectBase::Deleter::operator()
                ((Deleter *)&local_48,(QSlotObjectBase *)local_48.mobj);
    }
    if (!bVar11) goto LAB_002bda54;
  }
  LOCK();
  pQVar1 = (this->d_ptr)._q_value._M_b._M_p;
  (this->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar1 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(this,pQVar1);
  }
LAB_002bda54:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void queued_activate(QObject *sender, int signal, QObjectPrivate::Connection *c, void **argv)
{
    const int *argumentTypes = c->argumentTypes.loadRelaxed();
    if (!argumentTypes) {
        QMetaMethod m = QMetaObjectPrivate::signal(sender->metaObject(), signal);
        argumentTypes = queuedConnectionTypes(m);
        if (!argumentTypes) // cannot queue arguments
            argumentTypes = &DIRECT_CONNECTION_ONLY;
        if (!c->argumentTypes.testAndSetOrdered(nullptr, argumentTypes)) {
            if (argumentTypes != &DIRECT_CONNECTION_ONLY)
                delete[] argumentTypes;
            argumentTypes = c->argumentTypes.loadRelaxed();
        }
    }
    if (argumentTypes == &DIRECT_CONNECTION_ONLY) // cannot activate
        return;
    int nargs = 1; // include return type
    while (argumentTypes[nargs - 1])
        ++nargs;

    QMutexLocker locker(signalSlotLock(c->receiver.loadRelaxed()));
    QObject *receiver = c->receiver.loadRelaxed();
    if (!receiver) {
        // the connection has been disconnected before we got the lock
        return;
    }

    SlotObjectGuard slotObjectGuard { c->isSlotObject ? c->slotObj : nullptr };
    locker.unlock();

    QMetaCallEvent *ev = c->isSlotObject ?
        new QMetaCallEvent(c->slotObj, sender, signal, nargs) :
        new QMetaCallEvent(c->method_offset, c->method_relative, c->callFunction, sender, signal, nargs);

    void **args = ev->args();
    QMetaType *types = ev->types();

    types[0] = QMetaType(); // return type
    args[0] = nullptr; // return value

    if (nargs > 1) {
        for (int n = 1; n < nargs; ++n)
            types[n] = QMetaType(argumentTypes[n - 1]);

        for (int n = 1; n < nargs; ++n)
            args[n] = types[n].create(argv[n]);
    }

    if (c->isSingleShot && !QObjectPrivate::removeConnection(c)) {
        delete ev;
        return;
    }

    locker.relock();
    if (!c->isSingleShot && !c->receiver.loadRelaxed()) {
        // the connection has been disconnected while we were unlocked
        locker.unlock();
        delete ev;
        return;
    }

    QCoreApplication::postEvent(receiver, ev);
}